

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O0

Query * deduplicate_primitives(Query *q,bool *changed)

{
  bool bVar1;
  QueryType *pQVar2;
  reference this;
  Query *other;
  undefined1 *in_RDX;
  Query *in_RSI;
  Query *in_RDI;
  pair<std::_Rb_tree_const_iterator<PrimitiveQuery>,_bool> pVar3;
  Query *query;
  iterator __end1;
  iterator __begin1;
  vector<Query,_std::allocator<Query>_> *__range1;
  vector<Query,_std::allocator<Query>_> newqueries;
  set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_> seen;
  Query *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  _Rb_tree_const_iterator<PrimitiveQuery> in_stack_fffffffffffffec8;
  PrimitiveQuery in_stack_fffffffffffffed0;
  Query *in_stack_fffffffffffffed8;
  PrimitiveQuery in_stack_fffffffffffffee0;
  __normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_> local_80 [3];
  vector<Query,_std::allocator<Query>_> *local_68;
  undefined1 *local_18;
  Query *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pQVar2 = Query::get_type(in_RSI);
  if ((*pQVar2 == AND) || (pQVar2 = Query::get_type(local_10), *pQVar2 == OR)) {
    std::set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>::set
              ((set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_> *)
               0x1adf24);
    std::vector<Query,_std::allocator<Query>_>::vector
              ((vector<Query,_std::allocator<Query>_> *)0x1adf31);
    local_68 = Query::as_queries((Query *)in_stack_fffffffffffffed0);
    local_80[0]._M_current =
         (Query *)std::vector<Query,_std::allocator<Query>_>::begin(in_stack_fffffffffffffeb8);
    std::vector<Query,_std::allocator<Query>_>::end
              ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffeb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                               *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                              (__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>
                               *)in_stack_fffffffffffffeb8), bVar1) {
      this = __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::
             operator*(local_80);
      pQVar2 = Query::get_type(this);
      if (*pQVar2 == PRIMITIVE) {
        in_stack_fffffffffffffee0 = Query::as_ngram(in_stack_fffffffffffffed8);
        in_stack_fffffffffffffed8 =
             (Query *)std::
                      set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
                      ::count((set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
                               *)in_stack_fffffffffffffed0,
                              (key_type *)in_stack_fffffffffffffec8._M_node);
        if (in_stack_fffffffffffffed8 == (Query *)0x0) {
          std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                    ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffed0,
                     (Query *)in_stack_fffffffffffffec8._M_node);
          in_stack_fffffffffffffed0 = Query::as_ngram(in_stack_fffffffffffffed8);
          pVar3 = std::
                  set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>::
                  insert((set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
                          *)in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
          in_stack_fffffffffffffec8 = pVar3.first._M_node;
          in_stack_fffffffffffffec7 = pVar3.second;
        }
        else {
          *local_18 = 1;
        }
      }
      else {
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                  ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffed0,
                   (Query *)in_stack_fffffffffffffec8._M_node);
      }
      __gnu_cxx::__normal_iterator<Query_*,_std::vector<Query,_std::allocator<Query>_>_>::operator++
                (local_80);
    }
    other = (Query *)Query::get_type(local_10);
    Query::Query((Query *)in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->type,
                 (vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffed0);
    Query::Query((Query *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),other);
    Query::~Query((Query *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    std::vector<Query,_std::allocator<Query>_>::~vector
              ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffed0);
    std::set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>::~set
              ((set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_> *)
               0x1ae155);
  }
  else {
    Query::Query((Query *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
  }
  return in_RDI;
}

Assistant:

Query deduplicate_primitives(Query &&q, bool *changed) {
    if (q.get_type() != QueryType::AND && q.get_type() != QueryType::OR) {
        return std::move(q);
    }

    std::set<PrimitiveQuery> seen;
    std::vector<Query> newqueries;
    for (auto &&query : q.as_queries()) {
        if (query.get_type() != QueryType::PRIMITIVE) {
            newqueries.emplace_back(std::move(query));
        } else if (seen.count(query.as_ngram()) == 0) {
            newqueries.emplace_back(std::move(query));
            seen.insert(query.as_ngram());
        } else {
            *changed = true;
        }
    }
    return std::move(Query(q.get_type(), std::move(newqueries)));
}